

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::detail::ResultBuilder::ResultBuilder
          (ResultBuilder *this,Enum at,char *file,int line,char *expr,char *exception_type,
          String *exception_string)

{
  StringContains local_50;
  
  AssertData::StringContains::StringContains(&local_50,exception_string);
  AssertData::AssertData(&this->super_AssertData,at,file,line,expr,exception_type,&local_50);
  String::~String((String *)&local_50);
  return;
}

Assistant:

ResultBuilder::ResultBuilder(assertType::Enum at, const char* file, int line, const char* expr,
                                 const char* exception_type, const String& exception_string)
        : AssertData(at, file, line, expr, exception_type, exception_string) { }